

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void is_item_discoverable(tgestate_t *state)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  vischar_t *pvVar5;
  
  bVar2 = state->room_index;
  if (bVar2 == 0) {
    lVar3 = 0;
    do {
      if ((((char)(&state->item_structs[0].room_and_flags)[lVar3] < '\0') &&
          (bVar2 = (&state->item_structs[0].item_and_flags)[lVar3] & 0xf, bVar2 != 7)) &&
         (bVar2 != 0xb)) {
        pvVar5 = state->vischars;
        cVar1 = -7;
        do {
          pvVar5 = pvVar5 + 1;
          if ((pvVar5->character < 0x14) && ((pvVar5->mi).mappos.w < 0x20)) {
            pvVar5->flags = '\x01';
          }
          cVar1 = cVar1 + '\x01';
        } while (cVar1 != '\0');
        return;
      }
      lVar3 = lVar3 + 7;
    } while ((char)lVar3 != 'p');
  }
  else {
    lVar3 = 0;
    do {
      if ((((&state->item_structs[0].room_and_flags)[lVar3] & 0x3f) == bVar2) &&
         (uVar4 = (ulong)((&state->item_structs[0].item_and_flags)[lVar3] & 0xf),
         default_item_locations[uVar4].room_and_flags != bVar2 && uVar4 != 0xc)) {
        pvVar5 = state->vischars;
        cVar1 = -7;
        do {
          pvVar5 = pvVar5 + 1;
          if ((pvVar5->character < 0x14) && ((pvVar5->mi).mappos.w < 0x20)) {
            pvVar5->flags = '\x01';
          }
          cVar1 = cVar1 + '\x01';
        } while (cVar1 != '\0');
        return;
      }
      lVar3 = lVar3 + 7;
    } while ((char)lVar3 != 'p');
  }
  return;
}

Assistant:

void is_item_discoverable(tgestate_t *state)
{
  room_t              room;       /* was A */
  const itemstruct_t *itemstruct; /* was HL */
  uint8_t             iters;      /* was B */
  item_t              item;       /* was A */

  assert(state != NULL);

  room = state->room_index;
  if (room != room_0_OUTDOORS)
  {
    /* Interior. */

    if (is_item_discoverable_interior(state, room, NULL) == 0)
      /* Item was found. */
      hostiles_pursue(state);
  }
  else
  {
    /* Exterior. */

    itemstruct = &state->item_structs[0];
    iters      = item__LIMIT;
    do
    {
      if (itemstruct->room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
        goto nearby;
next:
      itemstruct++;
    }
    while (--iters);
    return;

nearby:
    /* FUTURE: Merge into loop. */
    item = itemstruct->item_and_flags & itemstruct_ITEM_MASK;

    /* The green key and food items are ignored. */
    if (item == item_GREEN_KEY || item == item_FOOD)
      goto next;

    /* BUG FIX: In the original game the itemstruct pointer is decremented to
     * access item_and_flags but is not re-adjusted afterwards. */

    hostiles_pursue(state);
  }
}